

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.c
# Opt level: O2

void WebRtcIsac_InitTransform(TransformTables *tables)

{
  long lVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = 0.0;
  for (lVar1 = -0x780; lVar1 != 0; lVar1 = lVar1 + 8) {
    dVar3 = cos(dVar2);
    *(double *)((long)tables->sintab1 + lVar1) = dVar3;
    dVar3 = sin(dVar2);
    *(double *)((long)tables->costab2 + lVar1) = dVar3;
    dVar2 = dVar2 + 0.013089969389957459;
  }
  dVar2 = 1.5642513420999162;
  for (lVar1 = -0x3c0; lVar1 != 0; lVar1 = lVar1 + 8) {
    dVar3 = cos(dVar2);
    *(double *)((long)tables->sintab2 + lVar1) = dVar3;
    dVar3 = sin(dVar2);
    *(double *)((long)tables[1].costab1 + lVar1) = dVar3;
    dVar2 = dVar2 + 3.1285026841998325;
  }
  return;
}

Assistant:

void WebRtcIsac_InitTransform(TransformTables* tables) {
  int k;
  double fact, phase;

  fact = PI / (FRAMESAMPLES_HALF);
  phase = 0.0;
  for (k = 0; k < FRAMESAMPLES_HALF; k++) {
    tables->costab1[k] = cos(phase);
    tables->sintab1[k] = sin(phase);
    phase += fact;
  }

  fact = PI * ((double) (FRAMESAMPLES_HALF - 1)) / ((double) FRAMESAMPLES_HALF);
  phase = 0.5 * fact;
  for (k = 0; k < FRAMESAMPLES_QUARTER; k++) {
    tables->costab2[k] = cos(phase);
    tables->sintab2[k] = sin(phase);
    phase += fact;
  }
}